

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointgrid.cpp
# Opt level: O1

bool __thiscall ON_PointGrid::Create(ON_PointGrid *this,int point_count0,int point_count1)

{
  if (0 < point_count1 && 0 < point_count0) {
    this->m_point_count[0] = point_count0;
    this->m_point_count[1] = point_count1;
    this->m_point_stride0 = point_count1;
    if ((uint)(this->m_point).super_ON_SimpleArray<ON_3dPoint>.m_capacity <
        (uint)(point_count1 * point_count0)) {
      ON_SimpleArray<ON_3dPoint>::SetCapacity
                (&(this->m_point).super_ON_SimpleArray<ON_3dPoint>,
                 (ulong)(uint)(point_count1 * point_count0));
    }
  }
  return 0 < point_count1 && 0 < point_count0;
}

Assistant:

bool
ON_PointGrid::Create(
        int point_count0,  // cv count0 (>= order0)
        int point_count1   // cv count1 (>= order1)
        )
{
  if ( point_count0 < 1 )
    return false;
  if ( point_count1 < 1 )
    return false;
  m_point_count[0] = point_count0;
  m_point_count[1] = point_count1;
  m_point_stride0 = m_point_count[1];
  m_point.Reserve(m_point_count[0]*m_point_count[1]);
  return true;
}